

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O3

void skiwi::inline_ieee754_flatan1(asmcode *code,compiler_options *param_2)

{
  uint64_t header;
  operand local_48 [4];
  operation local_38 [2];
  
  local_48[0] = AH;
  local_48[1] = 9;
  local_48[2] = 0x39;
  local_38[0] = ~CMPLTPD;
  local_38[1] = ~ADD;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_48,local_48 + 1,local_48 + 2,(unsigned_long *)local_38);
  local_38[0] = 0x16;
  local_48[0] = MEM_RAX;
  local_48[1] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,local_38,local_48,(int *)(local_48 + 1));
  local_38[0] = ADDSD;
  local_38[1] = 0x1000000;
  local_48[0] = ST6;
  local_48[1] = 10;
  local_48[2] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_48,local_48 + 1,local_48 + 2);
  local_48[0] = XMM6;
  local_48[1] = 10;
  local_48[2] = 0x39;
  local_48[3] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_48,local_48 + 1,local_48 + 2,(int *)(local_48 + 3));
  local_48[0] = ST6;
  local_48[1] = 9;
  local_48[2] = 0x39;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,local_48,local_48 + 1,local_48 + 2,(unsigned_long *)local_38);
  local_48[0] = ST6;
  local_48[1] = 0x20;
  local_48[2] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_48,local_48 + 1,local_48 + 2);
  local_48[0] = R14;
  assembler::asmcode::add<assembler::asmcode::operation>(code,local_48);
  local_48[0] = MEM_RDI;
  assembler::asmcode::add<assembler::asmcode::operation>(code,local_48);
  local_48[0] = MEM_R9;
  local_48[1] = 0x20;
  local_48[2] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,local_48,local_48 + 1,(int *)(local_48 + 2));
  local_48[0] = EMPTY;
  local_48[1] = 0x10;
  local_48[2] = 0x39;
  local_48[3] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_48,local_48 + 1,local_48 + 2,(int *)(local_48 + 3));
  local_48[0] = ST6;
  local_48[1] = 9;
  local_48[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_48,local_48 + 1,local_48 + 2);
  return;
}

Assistant:

void inline_ieee754_flatan1(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::FLD, ASM::asmcode::MEM_RAX, CELLS(1));

  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::FLD1);
  code.add(ASM::asmcode::FPATAN);
  code.add(ASM::asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }